

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  Span *pSVar2;
  FILE *pFVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  char16_t *pcVar12;
  Entry *pEVar13;
  char16_t *pcVar14;
  bool bVar15;
  char16_t *pcVar16;
  QArrayDataPointer<char> *pQVar17;
  long in_FS_OFFSET;
  QAnyStringView QVar18;
  piter local_6f8;
  QArrayDataPointer<char> local_6e8;
  Options options;
  undefined8 local_b8;
  undefined8 uStack_b0;
  int argc_local;
  QArrayDataPointer<char> local_a0;
  QArrayDataPointer<char> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8 = 0xaaaaaaaaaaaaaaaa;
  uStack_b0 = 0xaaaaaaaaaaaaaaaa;
  argc_local = argc;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_b8,&argc_local,argv,0x60a00);
  memset(&options,0xaa,0x610);
  parseOptions();
  if ((options.helpRequested != false) || (options.outputDirectory.d.size == 0)) {
    printHelp();
    iVar11 = 1;
    goto LAB_001224c4;
  }
  QElapsedTimer::start();
  bVar4 = readInputFile(&options);
  pFVar3 = _stdout;
  if (!bVar4) {
    iVar11 = 2;
    goto LAB_001224c4;
  }
  if (options.timing == true) {
    uVar8 = QElapsedTimer::nsecsElapsed();
    fprintf(pFVar3,"[TIMING] %lld ns: Read input file\n",uVar8);
  }
  pFVar3 = _stdout;
  QString::toLocal8Bit((QByteArray *)&local_58,&options.inputFileName);
  pQVar17 = (QArrayDataPointer<char> *)local_58.ptr;
  if ((QArrayDataPointer<char> *)local_58.ptr == (QArrayDataPointer<char> *)0x0) {
    pQVar17 = (QArrayDataPointer<char> *)&QByteArray::_empty;
  }
  QString::toLocal8Bit((QByteArray *)&local_70,&options.outputDirectory);
  pcVar14 = local_70.ptr;
  if (local_70.ptr == (char16_t *)0x0) {
    pcVar14 = (char16_t *)&QByteArray::_empty;
  }
  QString::toLocal8Bit((QByteArray *)&local_88,&options.applicationBinary);
  pcVar12 = (char16_t *)local_88.ptr;
  if ((char16_t *)local_88.ptr == (char16_t *)0x0) {
    pcVar12 = (char16_t *)&QByteArray::_empty;
  }
  QString::toLocal8Bit((QByteArray *)&local_a0,&options.androidPlatform);
  pcVar16 = (char16_t *)local_a0.ptr;
  if ((char16_t *)local_a0.ptr == (char16_t *)0x0) {
    pcVar16 = (char16_t *)&QByteArray::_empty;
  }
  if (options.installApk == true) {
    if (options.installLocation.d.size == 0) {
      pcVar7 = "Default device";
      goto LAB_0012251a;
    }
    QString::toLocal8Bit((QByteArray *)&local_6e8,&options.installLocation);
    pcVar7 = local_6e8.ptr;
    if (local_6e8.ptr == (char *)0x0) {
      pcVar7 = (char *)&QByteArray::_empty;
    }
    fprintf(pFVar3,
            "Generating Android Package\n  Input file: %s\n  Output directory: %s\n  Application binary: %s\n  Android build platform: %s\n  Install to device: %s\n"
            ,pQVar17,pcVar14,pcVar12,pcVar16,pcVar7);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_6e8);
  }
  else {
    pcVar7 = "No";
LAB_0012251a:
    fprintf(pFVar3,
            "Generating Android Package\n  Input file: %s\n  Output directory: %s\n  Application binary: %s\n  Android build platform: %s\n  Install to device: %s\n"
            ,pQVar17,pcVar14,pcVar12,pcVar16,pcVar7);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_a0);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  local_6f8.bucket = 0xaaaaaaaaaaaaaaaa;
  local_6f8.d = (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
                0xaaaaaaaaaaaaaaaa;
  local_6f8 = (piter)QHash<QString,_QtInstallDirectoryWithTriple>::constBegin
                               (&options.architectures);
  iVar11 = 3;
  bVar4 = false;
  while( true ) {
    if (local_6f8.d == (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)0x0 &&
        local_6f8.bucket == 0) break;
    pSVar2 = (local_6f8.d)->spans;
    uVar10 = local_6f8.bucket >> 7;
    pEVar13 = pSVar2[uVar10].entries;
    bVar1 = pSVar2[uVar10].offsets[(uint)local_6f8.bucket & 0x7f];
    if (pEVar13[bVar1].storage.data[0x50] == '\x01') {
      pEVar13 = pEVar13 + bVar1;
      Options::setCurrentQtArchitecture
                (&options,(QString *)pEVar13,(QString *)((long)(pEVar13->storage).data + 0x18),
                 (QHash<QString,_QString> *)((long)(pEVar13->storage).data + 0x30));
      bVar15 = true;
      bVar5 = !bVar4;
      bVar4 = bVar15;
      if (bVar5) {
        if ((options.build == true) && (options.copyDependenciesOnly == false)) {
          cleanAndroidFiles(&options);
          pFVar3 = _stdout;
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Cleaned Android file\n",uVar8);
          }
          bVar5 = copyAndroidTemplate(&options);
          pFVar3 = _stdout;
          if (!bVar5) goto LAB_001224c4;
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Copied Android template\n",uVar8);
          }
        }
        else {
          bVar4 = false;
        }
      }
      bVar5 = readDependencies(&options);
      pFVar3 = _stdout;
      if (!bVar5) {
        iVar11 = 4;
        goto LAB_001224c4;
      }
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Read dependencies\n",uVar8);
      }
      bVar5 = copyQtFiles(&options);
      pFVar3 = _stdout;
      if (!bVar5) {
        iVar11 = 6;
        goto LAB_001224c4;
      }
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Copied Qt files\n",uVar8);
      }
      bVar5 = copyAndroidExtraLibs(&options);
      pFVar3 = _stdout;
      if (!bVar5) {
        iVar11 = 10;
        goto LAB_001224c4;
      }
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ms: Copied extra libs\n",uVar8);
      }
      bVar5 = copyAndroidExtraResources(&options);
      pFVar3 = _stdout;
      if (!bVar5) {
        iVar11 = 0x13;
        goto LAB_001224c4;
      }
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Copied extra resources\n",uVar8);
      }
      bVar5 = copyStdCpp(&options);
      pFVar3 = _stdout;
      if (!bVar5) {
        iVar11 = 5;
        goto LAB_001224c4;
      }
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Copied GNU STL\n",uVar8);
      }
      if ((options.generateJavaQmlComponents == true) &&
         (iVar6 = generateJavaQmlComponents(&options), iVar6 == 0)) {
        iVar11 = 0x16;
        goto LAB_001224c4;
      }
      pFVar3 = _stdout;
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Generate Java QtQuickViewContents.\n",uVar8);
      }
      if (options.deploymentMechanism == Unbundled) {
        local_6e8.size = -0x5555555555555556;
        local_6e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_6e8.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_70.size = options.outputDirectory.d.size | 0x8000000000000000;
        local_70.d._0_1_ = 1;
        local_70.ptr = options.outputDirectory.d.ptr;
        local_88.size = options.currentArchitecture.d.size | 0x8000000000000000;
        local_88.d._0_1_ = 1;
        local_88.ptr = (char *)options.currentArchitecture.d.ptr;
        local_a0.size = options.applicationBinary.d.size | 0x8000000000000000;
        local_a0.d._0_1_ = 1;
        local_a0.ptr = (char *)options.applicationBinary.d.ptr;
        local_58.d = (Data *)&local_70;
        local_58.ptr = (char *)&local_88;
        local_58.size = (qsizetype)&local_a0;
        local_40 = 0;
        QVar18.m_size = (size_t)"%1/libs/%2/lib%3_%2.so";
        QVar18.field_0.m_data_utf8 = (char *)&local_6e8;
        QtPrivate::argToQString(QVar18,0x4000000000000016,(ArgBase **)0x3);
        QFile::remove((QString *)&local_6e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_6e8);
      }
      else {
        bVar5 = containsApplicationBinary(&options);
        if (!bVar5) {
          iVar11 = 7;
          goto LAB_001224c4;
        }
      }
      pFVar3 = _stdout;
      if (options.timing == true) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Checked for application binary\n",uVar8);
      }
      pFVar3 = _stdout;
      if ((options.timing & 1U) != 0) {
        uVar8 = QElapsedTimer::nsecsElapsed();
        fprintf(pFVar3,"[TIMING] %lld ns: Bundled Qt libs\n",uVar8);
      }
    }
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_>::operator++
              (&local_6f8);
  }
  if (options.copyDependenciesOnly == true) {
    iVar11 = 0;
    if (options.depFilePath.d.size != 0) {
      writeDependencyFile(&options);
    }
  }
  else {
    bVar4 = createRcc(&options);
    if (bVar4) {
      if (options.auxMode == true) {
        bVar4 = updateAndroidFiles(&options);
        iVar11 = 0xc;
        if (bVar4) {
          iVar11 = 0;
        }
      }
      else {
        if (options.build == true) {
          bVar4 = copyAndroidSources(&options);
          pFVar3 = _stdout;
          if (!bVar4) {
            iVar11 = 0xb;
            goto LAB_001224c4;
          }
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Copied android sources\n",uVar8);
          }
          bVar4 = updateAndroidFiles(&options);
          pFVar3 = _stdout;
          if (!bVar4) {
            iVar11 = 0xc;
            goto LAB_001224c4;
          }
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Updated files\n",uVar8);
          }
          pFVar3 = _stdout;
          if ((options.timing & 1U) != 0) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Created project\n",uVar8);
          }
          bVar4 = buildAndroidProject(&options);
          pFVar3 = _stdout;
          if (!bVar4) {
            iVar11 = 0xe;
            goto LAB_001224c4;
          }
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Built project\n",uVar8);
          }
          if ((options.keyStore.d.size != 0) && (bVar4 = signPackage(&options), !bVar4)) {
            iVar11 = 0xf;
            goto LAB_001224c4;
          }
          if ((options.apkPath.d.size != 0) && (bVar4 = copyPackage(&options), !bVar4)) {
            iVar11 = 0x14;
            goto LAB_001224c4;
          }
          pFVar3 = _stdout;
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Signed package\n",uVar8);
          }
        }
        if ((options.installApk != true) || (bVar4 = installApk(&options), bVar4)) {
          pFVar3 = _stdout;
          if (options.timing == true) {
            uVar8 = QElapsedTimer::nsecsElapsed();
            fprintf(pFVar3,"[TIMING] %lld ns: Installed APK\n",uVar8);
          }
          if (options.depFilePath.d.size != 0) {
            writeDependencyFile(&options);
          }
          pFVar3 = _stdout;
          lVar9 = QElapsedTimer::elapsed();
          fprintf(pFVar3,"Android package built successfully in %.3f ms.\n",
                  SUB84((double)lVar9 / 1000.0,0));
          if (options.installApk == true) {
            fwrite("  -- It can now be run from the selected device/emulator.\n",0x3a,1,_stdout);
          }
          pFVar3 = _stdout;
          packagePath((QString *)&local_70,&options,SignedAPK - (options.keyStore.d.size == 0));
          QString::toLocal8Bit((QByteArray *)&local_58,(QString *)&local_70);
          pQVar17 = (QArrayDataPointer<char> *)local_58.ptr;
          if ((QArrayDataPointer<char> *)local_58.ptr == (QArrayDataPointer<char> *)0x0) {
            pQVar17 = (QArrayDataPointer<char> *)&QByteArray::_empty;
          }
          iVar11 = 0;
          fprintf(pFVar3,"  -- File: %s\n",pQVar17);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
          fflush(_stdout);
        }
        else {
          iVar11 = 0x10;
        }
      }
    }
    else {
      iVar11 = 0x15;
    }
  }
LAB_001224c4:
  Options::~Options(&options);
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar11;
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);

    Options options = parseOptions();
    if (options.helpRequested || options.outputDirectory.isEmpty()) {
        printHelp();
        return SyntaxErrorOrHelpRequested;
    }

    options.timer.start();

    if (!readInputFile(&options))
        return CannotReadInputFile;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Read input file\n", options.timer.nsecsElapsed());

    fprintf(stdout,
            "Generating Android Package\n"
            "  Input file: %s\n"
            "  Output directory: %s\n"
            "  Application binary: %s\n"
            "  Android build platform: %s\n"
            "  Install to device: %s\n",
            qPrintable(options.inputFileName),
            qPrintable(options.outputDirectory),
            qPrintable(options.applicationBinary),
            qPrintable(options.androidPlatform),
            options.installApk
                ? (options.installLocation.isEmpty() ? "Default device" : qPrintable(options.installLocation))
                : "No"
            );

    bool androidTemplatetCopied = false;

    for (auto it = options.architectures.constBegin(); it != options.architectures.constEnd(); ++it) {
        if (!it->enabled)
            continue;
        options.setCurrentQtArchitecture(it.key(),
                                         it.value().qtInstallDirectory,
                                         it.value().qtDirectories);

        // All architectures have a copy of the gradle files but only one set needs to be copied.
        if (!androidTemplatetCopied && options.build && !options.copyDependenciesOnly) {
            cleanAndroidFiles(options);
            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Cleaned Android file\n", options.timer.nsecsElapsed());

            if (!copyAndroidTemplate(options))
                return CannotCopyAndroidTemplate;

            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Copied Android template\n", options.timer.nsecsElapsed());
            androidTemplatetCopied = true;
        }

        if (!readDependencies(&options))
            return CannotReadDependencies;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Read dependencies\n", options.timer.nsecsElapsed());

        if (!copyQtFiles(&options))
            return CannotCopyQtFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied Qt files\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraLibs(&options))
            return CannotCopyAndroidExtraLibs;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ms: Copied extra libs\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraResources(&options))
            return CannotCopyAndroidExtraResources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied extra resources\n", options.timer.nsecsElapsed());

        if (!copyStdCpp(&options))
            return CannotCopyGnuStl;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied GNU STL\n", options.timer.nsecsElapsed());

        if (options.generateJavaQmlComponents) {
            if (!generateJavaQmlComponents(options))
                return CannotGenerateJavaQmlComponents;
        }

        if (Q_UNLIKELY(options.timing)) {
            fprintf(stdout, "[TIMING] %lld ns: Generate Java QtQuickViewContents.\n",
                    options.timer.nsecsElapsed());
        }

        // If Unbundled deployment is used, remove app lib as we don't want it packaged inside the APK
        if (options.deploymentMechanism == Options::Unbundled) {
            QString appLibPath = "%1/libs/%2/lib%3_%2.so"_L1.
                    arg(options.outputDirectory,
                        options.currentArchitecture,
                        options.applicationBinary);
            QFile::remove(appLibPath);
        } else if (!containsApplicationBinary(&options)) {
            return CannotFindApplicationBinary;
        }

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Checked for application binary\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Bundled Qt libs\n", options.timer.nsecsElapsed());
    }

    if (options.copyDependenciesOnly) {
        if (!options.depFilePath.isEmpty())
            writeDependencyFile(options);
        return 0;
    }

    if (!createRcc(options))
        return CannotCreateRcc;

    if (options.auxMode) {
        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;
        return 0;
    }

    if (options.build) {
        if (!copyAndroidSources(options))
            return CannotCopyAndroidSources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied android sources\n", options.timer.nsecsElapsed());

        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Updated files\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Created project\n", options.timer.nsecsElapsed());

        if (!buildAndroidProject(options))
            return CannotBuildAndroidProject;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Built project\n", options.timer.nsecsElapsed());

        if (!options.keyStore.isEmpty() && !signPackage(options))
            return CannotSignPackage;

        if (!options.apkPath.isEmpty() && !copyPackage(options))
            return CannotCopyApk;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Signed package\n", options.timer.nsecsElapsed());
    }

    if (options.installApk && !installApk(options))
        return CannotInstallApk;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Installed APK\n", options.timer.nsecsElapsed());

    if (!options.depFilePath.isEmpty())
        writeDependencyFile(options);

    fprintf(stdout, "Android package built successfully in %.3f ms.\n", options.timer.elapsed() / 1000.);

    if (options.installApk)
        fprintf(stdout, "  -- It can now be run from the selected device/emulator.\n");

    fprintf(stdout, "  -- File: %s\n", qPrintable(packagePath(options, options.keyStore.isEmpty() ? UnsignedAPK
                                                                                              : SignedAPK)));
    fflush(stdout);
    return 0;
}